

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrioExecution.h
# Opt level: O0

void nrg::PrioExecution::
     push<void(*)(std::ostream&,int_const&),std::reference_wrapper<std::ostream>,int>
               (Queue *queue,_func_void_basic_ostream<char,_std::char_traits<char>_>_ptr_int_ptr *fn
               ,reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *param,
               int *param_4)

{
  QueueElement local_90;
  anon_class_24_3_7e084ec6 local_68;
  undefined1 local_50 [8];
  QueueElement elem;
  int *param_local_1;
  reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *param_local;
  _func_void_basic_ostream<char,_std::char_traits<char>_>_ptr_int_ptr *fn_local;
  Queue *queue_local;
  
  local_50._0_4_ = 0;
  elem.what._M_invoker = (_Invoker_type)param_4;
  local_50._4_4_ = next();
  local_68.param =
       (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>)param->_M_data;
  local_68._16_4_ = *(undefined4 *)elem.what._M_invoker;
  local_68.fn = fn;
  std::function<void()>::
  function<nrg::PrioExecution::push<void(*)(std::ostream&,int_const&),std::reference_wrapper<std::ostream>,int>(std::priority_queue<nrg::PrioExecution::QueueElement,std::vector<nrg::PrioExecution::QueueElement,std::allocator<nrg::PrioExecution::QueueElement>>,std::greater<nrg::PrioExecution::QueueElement>>&,void(*)(std::ostream&,int_const&),std::reference_wrapper<std::ostream>&&,int&&)::_lambda()_1_,void>
            ((function<void()> *)&elem,&local_68);
  QueueElement::QueueElement(&local_90,(QueueElement *)local_50);
  push(queue,&local_90);
  QueueElement::~QueueElement(&local_90);
  QueueElement::~QueueElement((QueueElement *)local_50);
  return;
}

Assistant:

static void push(Queue& queue, FN fn, Param&&... param)
    {
        QueueElement elem = { 0, next(), [=]() { fn(param...); } };
        push(queue, std::move(elem));
    }